

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xorfilter.h
# Opt level: O3

_Bool xor8_populate(uint64_t *keys,uint32_t size,xor8_t *filter)

{
  ulong *puVar1;
  uint uVar2;
  undefined4 uVar3;
  ulong uVar4;
  uint64_t uVar5;
  uint8_t *puVar6;
  size_t __size;
  long lVar7;
  void *__s;
  void *__ptr;
  void *__ptr_00;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  uint64_t uVar12;
  int *piVar13;
  long lVar14;
  ulong uVar15;
  _Bool _Var16;
  int iVar17;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  size_t i_1;
  long lVar23;
  byte bVar24;
  ulong uVar25;
  undefined4 *puVar26;
  uint32_t r0;
  ulong local_c0;
  uint uVar18;
  
  if (size == 0) {
    _Var16 = false;
  }
  else {
    local_c0 = (ulong)size;
    filter->seed = 0x910a2dec89025cc1;
    uVar4 = filter->blockLength;
    lVar7 = uVar4 * 0x10;
    __size = uVar4 * 0x30;
    __s = malloc(__size);
    __ptr = malloc(__size);
    __ptr_00 = malloc(local_c0 << 4);
    uVar18 = 0;
    if (__ptr_00 != (void *)0x0 && (__ptr != (void *)0x0 && __s != (void *)0x0)) {
      lVar8 = uVar4 * 0x20;
      uVar15 = 0x9e3779b97f4a7c16;
      uVar12 = uVar4;
      while( true ) {
        if (uVar18 + 1 == 10) {
          local_c0 = xor_sort_and_remove_dup(keys,local_c0 & 0xffffffff);
          uVar12 = filter->blockLength;
        }
        else if (99 < uVar18) {
          uVar18 = 0;
          goto LAB_00101b0d;
        }
        memset(__s,0,__size);
        uVar10 = local_c0 & 0xffffffff;
        if ((int)local_c0 != 0) {
          uVar5 = filter->seed;
          uVar20 = uVar12 & 0xffffffff;
          uVar19 = 0;
          do {
            uVar9 = keys[uVar19] + uVar5;
            uVar9 = (uVar9 >> 0x21 ^ uVar9) * -0xae502812aa7333;
            uVar9 = (uVar9 >> 0x21 ^ uVar9) * -0x3b314601e57a13ad;
            uVar22 = uVar9 >> 0x21 ^ uVar9;
            uVar25 = (uVar22 & 0xffffffff) * uVar20 >> 0x1c & 0xfffffffffffffff0;
            puVar1 = (ulong *)((long)__s + uVar25);
            *puVar1 = *puVar1 ^ uVar22;
            piVar13 = (int *)((long)__s + uVar25 + 8);
            *piVar13 = *piVar13 + 1;
            uVar9 = ((uint)(uVar22 << 0x15) | (uint)(uVar9 >> 0x2b)) * uVar20 >> 0x1c &
                    0xfffffffffffffff0;
            puVar1 = (ulong *)((long)__s + uVar9 + lVar7);
            *puVar1 = *puVar1 ^ uVar22;
            piVar13 = (int *)((long)__s + uVar9 + lVar7 + 8);
            *piVar13 = *piVar13 + 1;
            uVar9 = (uVar22 >> 0x16 & 0xffffffff) * uVar20 >> 0x1c & 0xfffffffffffffff0;
            puVar1 = (ulong *)((long)__s + uVar9 + lVar8);
            *puVar1 = *puVar1 ^ uVar22;
            piVar13 = (int *)((long)__s + uVar9 + lVar8 + 8);
            *piVar13 = *piVar13 + 1;
            uVar19 = uVar19 + 1;
          } while (uVar10 != uVar19);
        }
        if (uVar12 == 0) {
          lVar14 = 0;
          lVar11 = 0;
          lVar21 = 0;
        }
        else {
          lVar11 = 0;
          uVar20 = 0;
          piVar13 = (int *)((long)__s + 8);
          do {
            if (*piVar13 == 1) {
              *(int *)((long)__ptr + lVar11 * 0x10 + 8) = (int)uVar20;
              *(undefined8 *)((long)__ptr + lVar11 * 0x10) = *(undefined8 *)(piVar13 + -2);
              lVar11 = lVar11 + 1;
            }
            uVar20 = uVar20 + 1;
            piVar13 = piVar13 + 4;
          } while (uVar12 != uVar20);
          lVar14 = 0;
          uVar20 = 0;
          piVar13 = (int *)((long)__s + lVar7 + 8);
          do {
            if (*piVar13 == 1) {
              *(int *)((long)__ptr + lVar14 * 0x10 + lVar7 + 8) = (int)uVar20;
              *(undefined8 *)((long)__ptr + lVar14 * 0x10 + lVar7) = *(undefined8 *)(piVar13 + -2);
              lVar14 = lVar14 + 1;
            }
            uVar20 = uVar20 + 1;
            piVar13 = piVar13 + 4;
          } while (uVar12 != uVar20);
          lVar21 = 0;
          uVar20 = 0;
          piVar13 = (int *)((long)__s + lVar8 + 8);
          do {
            if (*piVar13 == 1) {
              *(int *)((long)__ptr + lVar21 * 0x10 + lVar8 + 8) = (int)uVar20;
              *(undefined8 *)((long)__ptr + lVar21 * 0x10 + lVar8) = *(undefined8 *)(piVar13 + -2);
              lVar21 = lVar21 + 1;
            }
            uVar20 = uVar20 + 1;
            piVar13 = piVar13 + 4;
          } while (uVar12 != uVar20);
        }
        if (lVar11 + lVar14 + lVar21 == 0) {
          uVar19 = 0;
        }
        else {
          uVar20 = uVar12 & 0xffffffff;
          uVar19 = 0;
          do {
            if (lVar11 != 0) {
              puVar26 = (undefined4 *)((long)__ptr + lVar11 * 0x10 + -4);
              do {
                uVar2 = puVar26[-1];
                if (*(int *)((long)__s + (ulong)uVar2 * 0x10 + 8) != 0) {
                  uVar9 = *(ulong *)(puVar26 + -3);
                  uVar3 = *puVar26;
                  uVar25 = ((uint)(uVar9 << 0x15) | (uint)(uVar9 >> 0x2b)) * uVar20;
                  lVar23 = uVar19 * 0x10;
                  *(ulong *)((long)__ptr_00 + lVar23) = uVar9;
                  *(uint *)((long)__ptr_00 + lVar23 + 8) = uVar2;
                  *(undefined4 *)((long)__ptr_00 + lVar23 + 0xc) = uVar3;
                  lVar23 = (uVar25 >> 0x20) * 0x10;
                  uVar22 = *(ulong *)((long)__s + lVar23 + lVar7) ^ uVar9;
                  *(ulong *)((long)__s + lVar23 + lVar7) = uVar22;
                  iVar17 = *(int *)((long)__s + lVar23 + lVar7 + 8) + -1;
                  *(int *)((long)__s + lVar23 + lVar7 + 8) = iVar17;
                  if (iVar17 == 1) {
                    *(int *)((long)__ptr + lVar14 * 0x10 + lVar7 + 8) = (int)(uVar25 >> 0x20);
                    *(ulong *)((long)__ptr + lVar14 * 0x10 + lVar7) = uVar22;
                    lVar14 = lVar14 + 1;
                  }
                  uVar22 = (uVar9 >> 0x16 & 0xffffffff) * uVar20;
                  uVar19 = uVar19 + 1;
                  lVar23 = (uVar22 >> 0x20) * 0x10;
                  uVar9 = uVar9 ^ *(ulong *)((long)__s + lVar23 + lVar8);
                  *(ulong *)((long)__s + lVar23 + lVar8) = uVar9;
                  iVar17 = *(int *)((long)__s + lVar23 + lVar8 + 8) + -1;
                  *(int *)((long)__s + lVar23 + lVar8 + 8) = iVar17;
                  if (iVar17 == 1) {
                    *(int *)((long)__ptr + lVar21 * 0x10 + lVar8 + 8) = (int)(uVar22 >> 0x20);
                    *(ulong *)((long)__ptr + lVar21 * 0x10 + lVar8) = uVar9;
                    lVar21 = lVar21 + 1;
                  }
                }
                lVar11 = lVar11 + -1;
                puVar26 = puVar26 + -4;
              } while (lVar11 != 0);
            }
            if (lVar14 == 0) {
              lVar11 = 0;
            }
            else {
              puVar26 = (undefined4 *)((long)__ptr + lVar14 * 0x10 + lVar7 + -4);
              lVar11 = 0;
              do {
                uVar2 = puVar26[-1];
                if (*(int *)((long)__s + (ulong)uVar2 * 0x10 + lVar7 + 8) != 0) {
                  uVar9 = *(ulong *)(puVar26 + -3);
                  uVar3 = *puVar26;
                  uVar25 = (uVar9 & 0xffffffff) * uVar20;
                  lVar23 = uVar19 * 0x10;
                  *(ulong *)((long)__ptr_00 + lVar23) = uVar9;
                  *(uint *)((long)__ptr_00 + lVar23 + 8) = uVar2 + (int)uVar4;
                  *(undefined4 *)((long)__ptr_00 + lVar23 + 0xc) = uVar3;
                  lVar23 = (uVar25 >> 0x20) * 0x10;
                  uVar22 = *(ulong *)((long)__s + lVar23) ^ uVar9;
                  *(ulong *)((long)__s + lVar23) = uVar22;
                  iVar17 = *(int *)((long)__s + lVar23 + 8) + -1;
                  *(int *)((long)__s + lVar23 + 8) = iVar17;
                  if (iVar17 == 1) {
                    *(int *)((long)__ptr + lVar11 * 0x10 + 8) = (int)(uVar25 >> 0x20);
                    *(ulong *)((long)__ptr + lVar11 * 0x10) = uVar22;
                    lVar11 = lVar11 + 1;
                  }
                  uVar22 = (uVar9 >> 0x16 & 0xffffffff) * uVar20;
                  uVar19 = uVar19 + 1;
                  lVar23 = (uVar22 >> 0x20) * 0x10;
                  uVar9 = uVar9 ^ *(ulong *)((long)__s + lVar23 + lVar8);
                  *(ulong *)((long)__s + lVar23 + lVar8) = uVar9;
                  iVar17 = *(int *)((long)__s + lVar23 + lVar8 + 8) + -1;
                  *(int *)((long)__s + lVar23 + lVar8 + 8) = iVar17;
                  if (iVar17 == 1) {
                    *(int *)((long)__ptr + lVar21 * 0x10 + lVar8 + 8) = (int)(uVar22 >> 0x20);
                    *(ulong *)((long)__ptr + lVar21 * 0x10 + lVar8) = uVar9;
                    lVar21 = lVar21 + 1;
                  }
                }
                lVar14 = lVar14 + -1;
                puVar26 = puVar26 + -4;
              } while (lVar14 != 0);
            }
            if (lVar21 == 0) {
              lVar14 = 0;
            }
            else {
              puVar26 = (undefined4 *)((long)__ptr + lVar21 * 0x10 + lVar8 + -4);
              lVar14 = 0;
              do {
                uVar2 = puVar26[-1];
                if (*(int *)((long)__s + (ulong)uVar2 * 0x10 + lVar8 + 8) != 0) {
                  uVar9 = *(ulong *)(puVar26 + -3);
                  uVar3 = *puVar26;
                  uVar25 = (uVar9 & 0xffffffff) * uVar20;
                  lVar23 = uVar19 * 0x10;
                  *(ulong *)((long)__ptr_00 + lVar23) = uVar9;
                  *(uint *)((long)__ptr_00 + lVar23 + 8) = uVar2 + (int)uVar4 * 2;
                  *(undefined4 *)((long)__ptr_00 + lVar23 + 0xc) = uVar3;
                  lVar23 = (uVar25 >> 0x20) * 0x10;
                  uVar22 = *(ulong *)((long)__s + lVar23) ^ uVar9;
                  *(ulong *)((long)__s + lVar23) = uVar22;
                  iVar17 = *(int *)((long)__s + lVar23 + 8) + -1;
                  *(int *)((long)__s + lVar23 + 8) = iVar17;
                  if (iVar17 == 1) {
                    *(int *)((long)__ptr + lVar11 * 0x10 + 8) = (int)(uVar25 >> 0x20);
                    *(ulong *)((long)__ptr + lVar11 * 0x10) = uVar22;
                    lVar11 = lVar11 + 1;
                  }
                  uVar22 = ((uint)(uVar9 << 0x15) | (uint)(uVar9 >> 0x2b)) * uVar20;
                  uVar19 = uVar19 + 1;
                  lVar23 = (uVar22 >> 0x20) * 0x10;
                  uVar9 = uVar9 ^ *(ulong *)((long)__s + lVar23 + lVar7);
                  *(ulong *)((long)__s + lVar23 + lVar7) = uVar9;
                  iVar17 = *(int *)((long)__s + lVar23 + lVar7 + 8) + -1;
                  *(int *)((long)__s + lVar23 + lVar7 + 8) = iVar17;
                  if (iVar17 == 1) {
                    *(int *)((long)__ptr + lVar14 * 0x10 + lVar7 + 8) = (int)(uVar22 >> 0x20);
                    *(ulong *)((long)__ptr + lVar14 * 0x10 + lVar7) = uVar9;
                    lVar14 = lVar14 + 1;
                  }
                }
                lVar21 = lVar21 + -1;
                puVar26 = puVar26 + -4;
              } while (lVar21 != 0);
            }
            lVar21 = 0;
          } while (lVar11 + lVar14 != 0);
        }
        if (uVar19 == uVar10) break;
        uVar15 = uVar15 + 0x9e3779b97f4a7c15;
        uVar10 = (uVar15 >> 0x1e ^ uVar15) * -0x40a7b892e31b1a47;
        uVar10 = (uVar10 >> 0x1b ^ uVar10) * -0x6b2fb644ecceee15;
        filter->seed = uVar10 >> 0x1f ^ uVar10;
        uVar18 = uVar18 + 1;
      }
      uVar18 = 1;
      if ((int)local_c0 != 0) {
        puVar6 = filter->fingerprints;
        lVar7 = uVar10 << 4;
        do {
          uVar15 = *(ulong *)((long)__ptr_00 + lVar7 + -0x10);
          uVar10 = (ulong)*(uint *)((long)__ptr_00 + lVar7 + -8);
          if (uVar10 < uVar4) {
            uVar20 = (ulong)(uint)filter->blockLength;
            bVar24 = puVar6[(((uint)(uVar15 << 0x15) | (uint)(uVar15 >> 0x2b)) * uVar20 >> 0x20) +
                            uVar4];
LAB_00101ab5:
            uVar9 = uVar15 >> 0x16;
            uVar19 = uVar4 * 2;
          }
          else {
            uVar20 = (ulong)(uint)filter->blockLength;
            bVar24 = puVar6[(uVar15 & 0xffffffff) * uVar20 >> 0x20];
            if (uVar10 < uVar4 * 2) goto LAB_00101ab5;
            uVar9 = uVar15 << 0x15 | uVar15 >> 0x2b;
            uVar19 = uVar4;
          }
          filter->fingerprints[uVar10] =
               (byte)(uVar15 >> 0x20) ^ (byte)uVar15 ^
               bVar24 ^ puVar6[((uVar9 & 0xffffffff) * uVar20 >> 0x20) + uVar19];
          lVar7 = lVar7 + -0x10;
        } while (lVar7 != 0);
        uVar18 = 1;
      }
    }
LAB_00101b0d:
    _Var16 = SUB41(uVar18,0);
    free(__s);
    free(__ptr);
    free(__ptr_00);
  }
  return _Var16;
}

Assistant:

static inline bool xor8_populate(uint64_t *keys, uint32_t size, xor8_t *filter) {
  if(size == 0) { return false; }
  uint64_t rng_counter = 1;
  filter->seed = xor_rng_splitmix64(&rng_counter);
  size_t arrayLength = (size_t)(filter->blockLength) * 3; // size of the backing array
  size_t blockLength = (size_t)(filter->blockLength);

  xor_xorset_t *sets =
      (xor_xorset_t *)malloc(arrayLength * sizeof(xor_xorset_t));

  xor_keyindex_t *Q =
      (xor_keyindex_t *)malloc(arrayLength * sizeof(xor_keyindex_t));

  xor_keyindex_t *stack =
      (xor_keyindex_t *)malloc(size * sizeof(xor_keyindex_t));

  if ((sets == NULL) || (Q == NULL) || (stack == NULL)) {
    free(sets);
    free(Q);
    free(stack);
    return false;
  }
  xor_xorset_t *sets0 = sets;
  xor_xorset_t *sets1 = sets + blockLength;
  xor_xorset_t *sets2 = sets + 2 * blockLength;
  xor_keyindex_t *Q0 = Q;
  xor_keyindex_t *Q1 = Q + blockLength;
  xor_keyindex_t *Q2 = Q + 2 * blockLength;

  int iterations = 0;

  while (true) {
    iterations ++;
    if(iterations == XOR_SORT_ITERATIONS) {
      size = (uint32_t)xor_sort_and_remove_dup(keys, size);
    }
    if(iterations > XOR_MAX_ITERATIONS) {
      // The probability of this happening is lower than the
      // the cosmic-ray probability (i.e., a cosmic ray corrupts your system).
      free(sets);
      free(Q);
      free(stack);
      return false;
    }

    memset(sets, 0, sizeof(xor_xorset_t) * arrayLength);
    for (size_t i = 0; i < size; i++) {
      uint64_t key = keys[i];
      xor_hashes_t hs = xor8_get_h0_h1_h2(key, filter);
      sets0[hs.h0].xormask ^= hs.h;
      sets0[hs.h0].count++;
      sets1[hs.h1].xormask ^= hs.h;
      sets1[hs.h1].count++;
      sets2[hs.h2].xormask ^= hs.h;
      sets2[hs.h2].count++;
    }
    // todo: the flush should be sync with the detection that follows
    // scan for values with a count of one
    size_t Q0size = 0, Q1size = 0, Q2size = 0;
    for (size_t i = 0; i < filter->blockLength; i++) {
      if (sets0[i].count == 1) {
        Q0[Q0size].index = (uint32_t)i;
        Q0[Q0size].hash = sets0[i].xormask;
        Q0size++;
      }
    }

    for (size_t i = 0; i < filter->blockLength; i++) {
      if (sets1[i].count == 1) {
        Q1[Q1size].index = (uint32_t)i;
        Q1[Q1size].hash = sets1[i].xormask;
        Q1size++;
      }
    }
    for (size_t i = 0; i < filter->blockLength; i++) {
      if (sets2[i].count == 1) {
        Q2[Q2size].index = (uint32_t)i;
        Q2[Q2size].hash = sets2[i].xormask;
        Q2size++;
      }
    }

    size_t stack_size = 0;
    while (Q0size + Q1size + Q2size > 0) {
      while (Q0size > 0) {
        xor_keyindex_t keyindex = Q0[--Q0size];
        size_t index = keyindex.index;
        if (sets0[index].count == 0)
          continue; // not actually possible after the initial scan.
        //sets0[index].count = 0;
        uint64_t hash = keyindex.hash;
        uint32_t h1 = xor8_get_h1(hash, filter);
        uint32_t h2 = xor8_get_h2(hash, filter);

        stack[stack_size] = keyindex;
        stack_size++;
        sets1[h1].xormask ^= hash;
        sets1[h1].count--;
        if (sets1[h1].count == 1) {
          Q1[Q1size].index = h1;
          Q1[Q1size].hash = sets1[h1].xormask;
          Q1size++;
        }
        sets2[h2].xormask ^= hash;
        sets2[h2].count--;
        if (sets2[h2].count == 1) {
          Q2[Q2size].index = h2;
          Q2[Q2size].hash = sets2[h2].xormask;
          Q2size++;
        }
      }
      while (Q1size > 0) {
        xor_keyindex_t keyindex = Q1[--Q1size];
        size_t index = keyindex.index;
        if (sets1[index].count == 0)
          continue;
        //sets1[index].count = 0;
        uint64_t hash = keyindex.hash;
        uint32_t h0 = xor8_get_h0(hash, filter);
        uint32_t h2 = xor8_get_h2(hash, filter);
        keyindex.index += (uint32_t)blockLength;
        stack[stack_size] = keyindex;
        stack_size++;
        sets0[h0].xormask ^= hash;
        sets0[h0].count--;
        if (sets0[h0].count == 1) {
          Q0[Q0size].index = h0;
          Q0[Q0size].hash = sets0[h0].xormask;
          Q0size++;
        }
        sets2[h2].xormask ^= hash;
        sets2[h2].count--;
        if (sets2[h2].count == 1) {
          Q2[Q2size].index = h2;
          Q2[Q2size].hash = sets2[h2].xormask;
          Q2size++;
        }
      }
      while (Q2size > 0) {
        xor_keyindex_t keyindex = Q2[--Q2size];
        size_t index = keyindex.index;
        if (sets2[index].count == 0)
          continue;

        //sets2[index].count = 0;
        uint64_t hash = keyindex.hash;

        uint32_t h0 = xor8_get_h0(hash, filter);
        uint32_t h1 = xor8_get_h1(hash, filter);
        keyindex.index += 2 * (uint32_t)blockLength;

        stack[stack_size] = keyindex;
        stack_size++;
        sets0[h0].xormask ^= hash;
        sets0[h0].count--;
        if (sets0[h0].count == 1) {
          Q0[Q0size].index = h0;
          Q0[Q0size].hash = sets0[h0].xormask;
          Q0size++;
        }
        sets1[h1].xormask ^= hash;
        sets1[h1].count--;
        if (sets1[h1].count == 1) {
          Q1[Q1size].index = h1;
          Q1[Q1size].hash = sets1[h1].xormask;
          Q1size++;
        }

      }
    }
    if (stack_size == size) {
      // success
      break;
    }

    filter->seed = xor_rng_splitmix64(&rng_counter);
  }
  uint8_t * fingerprints0 = filter->fingerprints;
  uint8_t * fingerprints1 = filter->fingerprints + blockLength;
  uint8_t * fingerprints2 = filter->fingerprints + 2 * blockLength;

  size_t stack_size = size;
  while (stack_size > 0) {
    xor_keyindex_t ki = stack[--stack_size];
    uint64_t val = xor_fingerprint(ki.hash);
    if(ki.index < blockLength) {
      val ^= (uint32_t)fingerprints1[xor8_get_h1(ki.hash,filter)] ^ fingerprints2[xor8_get_h2(ki.hash,filter)];
    } else if(ki.index < 2 * blockLength) {
      val ^= (uint32_t)fingerprints0[xor8_get_h0(ki.hash,filter)] ^ fingerprints2[xor8_get_h2(ki.hash,filter)];
    } else {
      val ^= (uint32_t)fingerprints0[xor8_get_h0(ki.hash,filter)] ^ fingerprints1[xor8_get_h1(ki.hash,filter)];
    }
    filter->fingerprints[ki.index] = (uint8_t)val;
  }

  free(sets);
  free(Q);
  free(stack);
  return true;
}